

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void mstate(SessionHandle *data,CURLMstate state)

{
  CURLMstate oldstate;
  CURLMstate state_local;
  SessionHandle *data_local;
  
  if ((data->mstate != state) && (data->mstate = state, state == CURLM_STATE_COMPLETED)) {
    data->multi->num_alive = data->multi->num_alive + -1;
  }
  return;
}

Assistant:

static void mstate(struct SessionHandle *data, CURLMstate state
#ifdef DEBUGBUILD
                   , int lineno
#endif
)
{
#ifdef DEBUGBUILD
  long connection_id = -5000;
#endif
  CURLMstate oldstate = data->mstate;

  if(oldstate == state)
    /* don't bother when the new state is the same as the old state */
    return;

  data->mstate = state;

#ifdef DEBUGBUILD
  if(data->mstate >= CURLM_STATE_CONNECT_PEND &&
     data->mstate < CURLM_STATE_COMPLETED) {
    if(data->easy_conn)
      connection_id = data->easy_conn->connection_id;

    infof(data,
          "STATE: %s => %s handle %p; line %d (connection #%ld) \n",
          statename[oldstate], statename[data->mstate],
          (void *)data, lineno, connection_id);
  }
#endif
  if(state == CURLM_STATE_COMPLETED)
    /* changing to COMPLETED means there's one less easy handle 'alive' */
    data->multi->num_alive--;
}